

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertpng.c
# Opt level: O1

int imagetopng(opj_image_t *image,char *write_idf)

{
  OPJ_UINT32 OVar1;
  opj_image_comp_t *poVar2;
  convert_32s_PXCX p_Var3;
  opj_image_comp_t *poVar4;
  OPJ_INT32 *pOVar5;
  png_bytep ppVar6;
  png_byte pVar7;
  int iVar8;
  uint uVar9;
  __jmp_buf_tag *__env;
  size_t __size;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  OPJ_INT32 OVar13;
  long lVar14;
  long lVar15;
  int prec;
  png_structp png;
  png_color_8 sig_bit;
  int fails;
  png_infop info;
  OPJ_INT32 *buffer32s;
  png_bytep row_buf;
  FILE *writer;
  char *local_88;
  uint local_80;
  uint local_7c;
  OPJ_SIZE_T local_78;
  OPJ_SIZE_T local_70;
  png_bytep local_68;
  convert_32sXXx_C1R local_60;
  OPJ_INT32 *planes [4];
  
  writer = (FILE *)0x0;
  png = (png_structp)0x0;
  info = (png_infop)0x0;
  row_buf = (png_bytep)0x0;
  buffer32s = (OPJ_INT32 *)0x0;
  fails = 1;
  sig_bit.red = '\0';
  sig_bit.green = '\0';
  sig_bit.blue = '\0';
  sig_bit.gray = '\0';
  sig_bit.alpha = '\0';
  poVar2 = image->comps;
  prec = poVar2->prec;
  planes[0] = poVar2->data;
  uVar9 = image->numcomps;
  uVar11 = 4;
  if ((int)uVar9 < 4) {
    uVar11 = uVar9;
  }
  uVar10 = 1;
  if (1 < (int)uVar9) {
    OVar1 = poVar2->dx;
    uVar12 = 1;
    poVar4 = poVar2;
    do {
      if ((((OVar1 != poVar4[1].dx) || (poVar2->dy != poVar4[1].dy)) || (prec != poVar4[1].prec)) ||
         (poVar2->sgnd != poVar4[1].sgnd)) {
        uVar10 = (uint)uVar12;
        break;
      }
      planes[uVar12] = poVar4[1].data;
      uVar12 = uVar12 + 1;
      uVar10 = uVar11;
      poVar4 = poVar4 + 1;
    } while (uVar11 != uVar12);
  }
  if (uVar10 != uVar11) {
    imagetopng_cold_1();
    return 1;
  }
  if (0 < (int)uVar9) {
    lVar14 = 0;
    do {
      clip_component((opj_image_comp_t *)((long)&image->comps->dx + lVar14),image->comps->prec);
      lVar14 = lVar14 + 0x40;
    } while ((ulong)uVar11 << 6 != lVar14);
  }
  if ((prec < 9) || (0xf < prec)) {
    if (((int)uVar9 < 2) || (7 < prec)) {
      if (((1 < prec) && (prec < 8)) && ((prec == 6 || ((prec & 1U) != 0)))) {
        if ((prec == 5) || (prec == 6)) {
          prec = 8;
        }
        else {
          prec = prec + 1;
        }
        if (0 < (int)uVar9) {
          lVar14 = 0;
          do {
            scale_component((opj_image_comp_t *)((long)&image->comps->dx + lVar14),prec);
            lVar14 = lVar14 + 0x40;
          } while ((ulong)uVar11 << 6 != lVar14);
        }
      }
    }
    else {
      lVar14 = 0;
      local_7c = uVar11;
      do {
        scale_component((opj_image_comp_t *)((long)&image->comps->dx + lVar14),8);
        lVar14 = lVar14 + 0x40;
      } while ((ulong)uVar11 << 6 != lVar14);
      prec = 8;
      uVar11 = local_7c;
    }
  }
  else {
    local_88 = write_idf;
    if (0 < (int)uVar9) {
      lVar14 = 0;
      do {
        scale_component((opj_image_comp_t *)((long)&image->comps->dx + lVar14),0x10);
        lVar14 = lVar14 + 0x40;
      } while ((ulong)uVar11 << 6 != lVar14);
    }
    prec = 0x10;
    write_idf = local_88;
  }
  if ((((prec != 1) && (prec != 2)) && (prec != 4)) && ((prec != 8 && (prec != 0x10)))) {
    fprintf(_stderr,"imagetopng: can not create %s\n\twrong bit_depth %d\n",write_idf,
            (ulong)(uint)prec);
    return 1;
  }
  writer = (FILE *)fopen(write_idf,"wb");
  if ((FILE *)writer == (FILE *)0x0) {
    return 1;
  }
  png = (png_structp)png_create_write_struct("1.6.37",0,0);
  if ((png == (png_structp)0x0) ||
     (info = (png_infop)png_create_info_struct(png), info == (png_infop)0x0)) goto LAB_00113755;
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
  iVar8 = _setjmp(__env);
  if (iVar8 != 0) goto LAB_00113755;
  png_init_io(png,writer);
  png_set_compression_level(png,9);
  pVar7 = (png_byte)prec;
  if ((int)uVar9 < 3) {
    sig_bit.gray = pVar7;
    uVar9 = 0;
  }
  else {
    sig_bit.blue = pVar7;
    sig_bit.green = pVar7;
    sig_bit.red = pVar7;
    uVar9 = 2;
  }
  if ((uVar11 & 1) == 0) {
    uVar9 = uVar9 | 4;
    sig_bit.alpha = pVar7;
  }
  png_set_IHDR(png,info,image->comps->w,image->comps->h,prec,uVar9,0,0,0);
  png_set_sBIT(png,info,&sig_bit);
  png_write_info(png,info);
  __size = png_get_rowbytes(png,info);
  lVar14 = (long)(int)uVar11;
  lVar15 = (ulong)image->comps->w * lVar14;
  if (prec * lVar15 + 7U >> 3 == __size) {
    row_buf = (png_bytep)malloc(__size);
    if (row_buf == (png_bytep)0x0) {
      imagetopng_cold_4();
      goto LAB_00113a3e;
    }
    buffer32s = (OPJ_INT32 *)malloc(lVar15 * 4);
    iVar8 = 0;
    if (buffer32s == (OPJ_INT32 *)0x0) {
      imagetopng_cold_3();
      goto LAB_00113a3e;
    }
  }
  else {
    imagetopng_cold_2();
LAB_00113a3e:
    iVar8 = 0x11;
  }
  ppVar6 = row_buf;
  pOVar5 = buffer32s;
  if (iVar8 != 0x11) {
    if (iVar8 != 0) {
      return iVar8;
    }
    p_Var3 = convert_32s_PXCX_LUT[lVar14];
    if (image->comps->sgnd == 0) {
      OVar13 = 0;
    }
    else {
      OVar13 = 1 << (pVar7 - 1 & 0x1f);
    }
    local_60 = (convert_32sXXx_C1R)0x0;
    if ((uint)prec < 0x11) {
      if ((0x116U >> (prec & 0x1fU) & 1) == 0) {
        if (prec == 0x10) {
          local_60 = convert_32s16u_C1R;
        }
      }
      else {
        local_60 = convert_32sXXu_C1R_LUT[prec];
      }
    }
    local_68 = row_buf;
    local_88 = write_idf;
    if (image->comps->h != 0) {
      uVar12 = (ulong)image->comps->w;
      local_78 = lVar14 * uVar12;
      uVar9 = 0;
      local_70 = uVar12;
      do {
        local_80 = uVar9;
        (*p_Var3)(planes,pOVar5,local_70,OVar13);
        (*local_60)(pOVar5,ppVar6,local_78);
        png_write_row(png,ppVar6);
        planes[0] = planes[0] + uVar12;
        planes[1] = planes[1] + uVar12;
        planes[2] = planes[2] + uVar12;
        planes[3] = planes[3] + uVar12;
        uVar9 = local_80 + 1;
      } while (uVar9 < image->comps->h);
    }
    png_write_end(png,info);
    fails = 0;
    write_idf = local_88;
  }
LAB_00113755:
  if (png != (png_structp)0x0) {
    png_destroy_write_struct(&png,&info);
  }
  if (row_buf != (png_bytep)0x0) {
    free(row_buf);
  }
  if (buffer32s != (OPJ_INT32 *)0x0) {
    free(buffer32s);
  }
  fclose((FILE *)writer);
  if (fails != 0) {
    remove(write_idf);
  }
  return fails;
}

Assistant:

int imagetopng(opj_image_t * image, const char *write_idf)
{
    FILE * volatile writer = NULL;
    png_structp png = NULL;
    png_infop info = NULL;
    png_bytep volatile row_buf = NULL;
    int nr_comp, color_type;
    volatile int prec;
    png_color_8 sig_bit;
    OPJ_INT32 const* planes[4];
    int i;
    OPJ_INT32* volatile buffer32s = NULL;

    volatile int fails = 1;

    memset(&sig_bit, 0, sizeof(sig_bit));
    prec = (int)image->comps[0].prec;
    planes[0] = image->comps[0].data;
    nr_comp = (int)image->numcomps;

    if (nr_comp > 4) {
        nr_comp = 4;
    }
    for (i = 1; i < nr_comp; ++i) {
        if (image->comps[0].dx != image->comps[i].dx) {
            break;
        }
        if (image->comps[0].dy != image->comps[i].dy) {
            break;
        }
        if (image->comps[0].prec != image->comps[i].prec) {
            break;
        }
        if (image->comps[0].sgnd != image->comps[i].sgnd) {
            break;
        }
        planes[i] = image->comps[i].data;
    }
    if (i != nr_comp) {
        fprintf(stderr,
                "imagetopng: All components shall have the same subsampling, same bit depth, same sign.\n");
        fprintf(stderr, "\tAborting\n");
        return 1;
    }
    for (i = 0; i < nr_comp; ++i) {
        clip_component(&(image->comps[i]), image->comps[0].prec);
    }
    if (prec > 8 && prec < 16) {
        for (i = 0; i < nr_comp; ++i) {
            scale_component(&(image->comps[i]), 16);
        }
        prec = 16;
    } else if (prec < 8 && nr_comp > 1) { /* GRAY_ALPHA, RGB, RGB_ALPHA */
        for (i = 0; i < nr_comp; ++i) {
            scale_component(&(image->comps[i]), 8);
        }
        prec = 8;
    } else if ((prec > 1) && (prec < 8) && ((prec == 6) ||
                                            ((prec & 1) == 1))) { /* GRAY with non native precision */
        if ((prec == 5) || (prec == 6)) {
            prec = 8;
        } else {
            prec++;
        }
        for (i = 0; i < nr_comp; ++i) {
            scale_component(&(image->comps[i]), (OPJ_UINT32)prec);
        }
    }

    if (prec != 1 && prec != 2 && prec != 4 && prec != 8 && prec != 16) {
        fprintf(stderr, "imagetopng: can not create %s\n\twrong bit_depth %d\n",
                write_idf, prec);
        return fails;
    }

    writer = fopen(write_idf, "wb");

    if (writer == NULL) {
        return fails;
    }

    /* Create and initialize the png_struct with the desired error handler
     * functions.  If you want to use the default stderr and longjump method,
     * you can supply NULL for the last three parameters.  We also check that
     * the library version is compatible with the one used at compile time,
     * in case we are using dynamically linked libraries.  REQUIRED.
     */
    png = png_create_write_struct(PNG_LIBPNG_VER_STRING,
                                  NULL, NULL, NULL);
    /*png_voidp user_error_ptr, user_error_fn, user_warning_fn); */

    if (png == NULL) {
        goto fin;
    }

    /* Allocate/initialize the image information data.  REQUIRED
     */
    info = png_create_info_struct(png);

    if (info == NULL) {
        goto fin;
    }

    /* Set error handling.  REQUIRED if you are not supplying your own
     * error handling functions in the png_create_write_struct() call.
     */
    if (setjmp(png_jmpbuf(png))) {
        goto fin;
    }

    /* I/O initialization functions is REQUIRED
     */
    png_init_io(png, writer);

    /* Set the image information here.  Width and height are up to 2^31,
     * bit_depth is one of 1, 2, 4, 8, or 16, but valid values also depend on
     * the color_type selected. color_type is one of PNG_COLOR_TYPE_GRAY,
     * PNG_COLOR_TYPE_GRAY_ALPHA, PNG_COLOR_TYPE_PALETTE, PNG_COLOR_TYPE_RGB,
     * or PNG_COLOR_TYPE_RGB_ALPHA.  interlace is either PNG_INTERLACE_NONE or
     * PNG_INTERLACE_ADAM7, and the compression_type and filter_type MUST
     * currently be PNG_COMPRESSION_TYPE_BASE and PNG_FILTER_TYPE_BASE.
     * REQUIRED
     *
     * ERRORS:
     *
     * color_type == PNG_COLOR_TYPE_PALETTE && bit_depth > 8
     * color_type == PNG_COLOR_TYPE_RGB && bit_depth < 8
     * color_type == PNG_COLOR_TYPE_GRAY_ALPHA && bit_depth < 8
     * color_type == PNG_COLOR_TYPE_RGB_ALPHA) && bit_depth < 8
     *
     */
    png_set_compression_level(png, Z_BEST_COMPRESSION);

    if (nr_comp >= 3) { /* RGB(A) */
        color_type = PNG_COLOR_TYPE_RGB;
        sig_bit.red = sig_bit.green = sig_bit.blue = (png_byte)prec;
    } else { /* GRAY(A) */
        color_type = PNG_COLOR_TYPE_GRAY;
        sig_bit.gray = (png_byte)prec;
    }
    if ((nr_comp & 1) == 0) { /* ALPHA */
        color_type |= PNG_COLOR_MASK_ALPHA;
        sig_bit.alpha = (png_byte)prec;
    }

    png_set_IHDR(png, info, image->comps[0].w, image->comps[0].h, prec, color_type,
                 PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_BASE,  PNG_FILTER_TYPE_BASE);

    png_set_sBIT(png, info, &sig_bit);
    /* png_set_gamma(png, 2.2, 1./2.2); */
    /* png_set_sRGB(png, info, PNG_sRGB_INTENT_PERCEPTUAL); */
    png_write_info(png, info);

    /* setup conversion */
    {
        OPJ_SIZE_T rowStride;
        png_size_t png_row_size;

        png_row_size = png_get_rowbytes(png, info);
        rowStride = ((OPJ_SIZE_T)image->comps[0].w * (OPJ_SIZE_T)nr_comp *
                     (OPJ_SIZE_T)prec + 7U) / 8U;
        if (rowStride != (OPJ_SIZE_T)png_row_size) {
            fprintf(stderr, "Invalid PNG row size\n");
            goto fin;
        }
        row_buf = (png_bytep)malloc(png_row_size);
        if (row_buf == NULL) {
            fprintf(stderr, "Can't allocate memory for PNG row\n");
            goto fin;
        }
        buffer32s = (OPJ_INT32*)malloc((OPJ_SIZE_T)image->comps[0].w *
                                       (OPJ_SIZE_T)nr_comp * sizeof(OPJ_INT32));
        if (buffer32s == NULL) {
            fprintf(stderr, "Can't allocate memory for interleaved 32s row\n");
            goto fin;
        }
    }

    /* convert */
    {
        OPJ_SIZE_T width = image->comps[0].w;
        OPJ_UINT32 y;
        convert_32s_PXCX cvtPxToCx = convert_32s_PXCX_LUT[nr_comp];
        convert_32sXXx_C1R cvt32sToPack = NULL;
        OPJ_INT32 adjust = image->comps[0].sgnd ? 1 << (prec - 1) : 0;
        png_bytep row_buf_cpy = row_buf;
        OPJ_INT32* buffer32s_cpy = buffer32s;

        switch (prec) {
        case 1:
        case 2:
        case 4:
        case 8:
            cvt32sToPack = convert_32sXXu_C1R_LUT[prec];
            break;
        case 16:
            cvt32sToPack = convert_32s16u_C1R;
            break;
        default:
            /* never here */
            break;
        }

        for (y = 0; y < image->comps[0].h; ++y) {
            cvtPxToCx(planes, buffer32s_cpy, width, adjust);
            cvt32sToPack(buffer32s_cpy, row_buf_cpy, width * (OPJ_SIZE_T)nr_comp);
            png_write_row(png, row_buf_cpy);
            planes[0] += width;
            planes[1] += width;
            planes[2] += width;
            planes[3] += width;
        }
    }

    png_write_end(png, info);

    fails = 0;

fin:
    if (png) {
        png_destroy_write_struct(&png, &info);
    }
    if (row_buf) {
        free(row_buf);
    }
    if (buffer32s) {
        free(buffer32s);
    }
    fclose(writer);

    if (fails) {
        (void)remove(write_idf);    /* ignore return value */
    }

    return fails;
}